

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O3

void deqp::gls::Functional::anon_unknown_0::FramebufferClearCase::clearBuffers
               (Functions *gl,Color color,float depth,int stencil)

{
  GLint local_10;
  GLfloat local_c;
  
  local_c = 1.0;
  local_10 = 0;
  if ((ulong)color.type < 3) {
    (*(&gl->clearBufferfv)[color.type])(0x1800,0,(GLfloat *)&color.field_1);
  }
  (*gl->clearBufferfv)(0x1801,0,&local_c);
  (*gl->clearBufferiv)(0x1802,0,&local_10);
  return;
}

Assistant:

void FramebufferClearCase::clearBuffers (const glw::Functions& gl, Color color, float depth, int stencil)
{
	switch(color.type)
	{
		case Color::FLOAT:	gl.clearBufferfv (GL_COLOR, 0, color.f); break;
		case Color::INT:	gl.clearBufferiv (GL_COLOR, 0, color.i); break;
		case Color::UINT:	gl.clearBufferuiv(GL_COLOR, 0, color.u); break;
		default:
			DE_ASSERT(false);
	}

	gl.clearBufferfv(GL_DEPTH, 0, &depth);
	gl.clearBufferiv(GL_STENCIL, 0, &stencil);
}